

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapLandB18(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  uint64_t uVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v;
  int v11;
  int v22;
  int v20;
  int vt2;
  int v02;
  int vt0;
  int v00;
  int *vz2;
  int *vz1;
  int *vz0;
  uint64_t cs;
  uint64_t ss;
  int err;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long local_50;
  long local_48;
  int local_4;
  
  lVar4 = (long)(in_R8D + 2);
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,lVar4,
                       (long)(in_R9D + 2));
  if (local_4 == 0) {
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      piVar5 = (int *)(in_RSI + local_50 * lVar4 * 4);
      piVar6 = (int *)(in_RSI + (local_50 + 2) * lVar4 * 4);
      local_84 = *piVar5;
      local_8c = *piVar6;
      local_90 = piVar6[1];
      local_88 = piVar5[1];
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        iVar3 = *(int *)(in_RSI + (local_50 + 1) * lVar4 * 4 + 4 + local_48 * 4);
        iVar1 = piVar5[local_48 + 2];
        iVar2 = piVar6[local_48 + 2];
        if ((iVar3 == 0) && ((((local_84 != 0 || (local_8c != 0)) || (iVar1 != 0)) || (iVar2 != 0)))
           ) {
          uVar7 = getChunkSeed(0,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          iVar3 = mcFirstInt(uVar7,3);
          iVar3 = iVar3 / 2;
        }
        else if ((iVar3 == 1) &&
                (((local_84 != 1 || (local_8c != 1)) || ((iVar1 != 1 || (iVar2 != 1)))))) {
          uVar7 = getChunkSeed(0x100000001,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
          iVar3 = mcFirstInt(uVar7,5);
          iVar3 = 1 - iVar3 / 4;
        }
        *(int *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = iVar3;
        local_84 = local_88;
        local_8c = local_90;
        local_90 = iVar2;
        local_88 = iVar1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapLandB18(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, (int)pW, (int)pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        int v00 = vz0[0], vt0 = vz0[1];
        int v02 = vz2[0], vt2 = vz2[1];
        int v20, v22;
        int v11, v;

        for (i = 0; i < w; i++)
        {
            v11 = vz1[i+1];
            v20 = vz0[i+2];
            v22 = vz2[i+2];
            v = v11;

            if (v11 == 0 && (v00 != 0 || v02 != 0 || v20 != 0 || v22 != 0))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = mcFirstInt(cs, 3) / 2;
            }
            else if (v11 == 1 && (v00 != 1 || v02 != 1 || v20 != 1 || v22 != 1))
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v = 1 - mcFirstInt(cs, 5) / 4;
            }

            out[i + j*w] = v;
            v00 = vt0; vt0 = v20;
            v02 = vt2; vt2 = v22;
        }
    }

    return 0;
}